

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

char * JS_AtomGetStrRT(JSRuntime *rt,char *buf,int buf_size,JSAtom atom)

{
  long lVar1;
  byte bVar2;
  BOOL BVar3;
  uint32_t uVar4;
  int iVar5;
  JSAtom in_ECX;
  int in_EDX;
  uint8_t *in_RSI;
  long in_RDI;
  JSString *str;
  char *q;
  int c;
  int i;
  JSAtomStruct *p;
  uint8_t *local_38;
  uint local_30;
  int local_2c;
  
  BVar3 = __JS_AtomIsTaggedInt(in_ECX);
  if (BVar3 == 0) {
    if (in_ECX == 0) {
      snprintf((char *)in_RSI,(long)in_EDX,"<null>");
    }
    else {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x60) + (ulong)in_ECX * 8);
      local_38 = in_RSI;
      if (lVar1 != 0) {
        if ((*(ulong *)(lVar1 + 4) >> 0x1f & 1) == 0) {
          bVar2 = 0;
          for (local_2c = 0; local_2c < (int)((uint)*(undefined8 *)(lVar1 + 4) & 0x7fffffff);
              local_2c = local_2c + 1) {
            bVar2 = *(byte *)(lVar1 + 0x10 + (long)local_2c) | bVar2;
          }
          if (bVar2 < 0x80) {
            return (char *)(lVar1 + 0x10);
          }
        }
        for (local_2c = 0; local_2c < (int)((uint)*(undefined8 *)(lVar1 + 4) & 0x7fffffff);
            local_2c = local_2c + 1) {
          if ((*(ulong *)(lVar1 + 4) >> 0x1f & 1) == 0) {
            local_30 = (uint)*(byte *)(lVar1 + 0x10 + (long)local_2c);
          }
          else {
            local_30 = (uint)*(ushort *)(lVar1 + 0x10 + (long)local_2c * 2);
          }
          if ((long)(in_EDX + -6) <= (long)local_38 - (long)in_RSI) break;
          if (local_30 < 0x80) {
            *local_38 = (uint8_t)local_30;
            local_38 = local_38 + 1;
          }
          else {
            iVar5 = unicode_to_utf8(local_38,local_30);
            local_38 = local_38 + iVar5;
          }
        }
      }
      *local_38 = '\0';
    }
  }
  else {
    uVar4 = __JS_AtomToUInt32(in_ECX);
    snprintf((char *)in_RSI,(long)in_EDX,"%u",(ulong)uVar4);
  }
  return (char *)in_RSI;
}

Assistant:

static const char *JS_AtomGetStrRT(JSRuntime *rt, char *buf, int buf_size,
                                   JSAtom atom)
{
    if (__JS_AtomIsTaggedInt(atom)) {
        snprintf(buf, buf_size, "%u", __JS_AtomToUInt32(atom));
    } else {
        JSAtomStruct *p;
        assert(atom < rt->atom_size);
        if (atom == JS_ATOM_NULL) {
            snprintf(buf, buf_size, "<null>");
        } else {
            int i, c;
            char *q;
            JSString *str;

            q = buf;
            p = rt->atom_array[atom];
            assert(!atom_is_free(p));
            str = p;
            if (str) {
                if (!str->is_wide_char) {
                    /* special case ASCII strings */
                    c = 0;
                    for(i = 0; i < str->len; i++) {
                        c |= str->u.str8[i];
                    }
                    if (c < 0x80)
                        return (const char *)str->u.str8;
                }
                for(i = 0; i < str->len; i++) {
                    if (str->is_wide_char)
                        c = str->u.str16[i];
                    else
                        c = str->u.str8[i];
                    if ((q - buf) >= buf_size - UTF8_CHAR_LEN_MAX)
                        break;
                    if (c < 128) {
                        *q++ = c;
                    } else {
                        q += unicode_to_utf8((uint8_t *)q, c);
                    }
                }
            }
            *q = '\0';
        }
    }
    return buf;
}